

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestbools::runTestCase(TestValueTestbools *this)

{
  bool bVar1;
  long in_RDI;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  IsCheck checks;
  Value *in_stack_000005a8;
  char *in_stack_ffffffffffffff10;
  char *expr;
  char *in_stack_ffffffffffffff18;
  uint uVar2;
  char *file;
  TestResult *in_stack_ffffffffffffff20;
  TestResult *result;
  float actual;
  char *in_stack_ffffffffffffff28;
  double expected;
  TestResult *in_stack_ffffffffffffff30;
  TestResult *result_00;
  undefined8 in_stack_ffffffffffffff60;
  ValueType other;
  Value *in_stack_ffffffffffffff68;
  undefined4 local_78 [2];
  char *local_70;
  undefined4 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48 [2];
  char *local_40;
  undefined4 local_38;
  char *pcVar3;
  Value *value;
  ValueTest *this_00;
  IsCheck local_14;
  
  other = (ValueType)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  Json::Value::type((Value *)(in_RDI + 0x240));
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (in_stack_ffffffffffffff30,(ValueType)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (ValueType)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10);
  ValueTest::IsCheck::IsCheck(&local_14);
  local_14.isBool_ = true;
  local_48[0] = **(undefined4 **)(in_RDI + 8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_38 = 0x142;
  pcVar3 = "checkIs(false_, checks)";
  value = (Value *)0x0;
  this_00 = (ValueTest *)0x0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_48;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_48;
  ValueTest::checkIs((ValueTest *)0x0,(Value *)0x0,(IsCheck *)"checkIs(false_, checks)");
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_78[0] = **(undefined4 **)(in_RDI + 8);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_68 = 0x143;
  local_60 = "checkIs(true_, checks)";
  local_58 = 0;
  local_50 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_78;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_78;
  ValueTest::checkIs(this_00,value,(IsCheck *)pcVar3);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_ffffffffffffff68,other);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  pcVar3 = *(char **)(in_RDI + 8);
  Json::Value::asBool((Value *)_minitest_Context.expr_);
  JsonTest::checkEqual<bool,bool>
            (in_stack_ffffffffffffff20,SUB41(uVar2 >> 0x18,0),SUB41(uVar2 >> 0x10,0),
             in_stack_ffffffffffffff10,(uint)((ulong)pcVar3 >> 0x20),(char *)0x148455);
  expr = *(char **)(in_RDI + 8);
  Json::Value::asInt(in_stack_000005a8);
  JsonTest::checkEqual<int,int>
            (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (int)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,uVar2,expr);
  file = *(char **)(in_RDI + 8);
  Json::Value::asLargestInt((Value *)0x1484ae);
  JsonTest::checkEqual<int,long_long>
            (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (longlong)in_stack_ffffffffffffff20,file,(uint)((ulong)expr >> 0x20),pcVar3);
  result = *(TestResult **)(in_RDI + 8);
  Json::Value::asUInt(in_stack_000005a8);
  JsonTest::checkEqual<int,unsigned_int>
            (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint)in_stack_ffffffffffffff28,(char *)result,(uint)((ulong)file >> 0x20),expr);
  expected = *(double *)(in_RDI + 8);
  Json::Value::asLargestUInt((Value *)0x14852d);
  JsonTest::checkEqual<int,unsigned_long_long>
            (in_stack_ffffffffffffff30,(int)((ulong)expected >> 0x20),(unsigned_long_long)result,
             file,(uint)((ulong)expr >> 0x20),pcVar3);
  result_00 = *(TestResult **)(in_RDI + 8);
  Json::Value::asDouble((Value *)_minitest_Context.failure_);
  JsonTest::checkEqual<double,double>
            (result_00,expected,(double)result,file,(uint)((ulong)expr >> 0x20),pcVar3);
  Json::Value::asFloat((Value *)_minitest_Context.failure_);
  JsonTest::checkEqual<double,float>
            (result_00,expected,(float)((ulong)result >> 0x20),file,(uint)((ulong)expr >> 0x20),
             pcVar3);
  Json::Value::asBool((Value *)_minitest_Context.expr_);
  JsonTest::checkEqual<bool,bool>
            (result,SUB81((ulong)file >> 0x38,0),SUB81((ulong)file >> 0x30,0),expr,
             (uint)((ulong)pcVar3 >> 0x20),(char *)0x148619);
  Json::Value::asInt(in_stack_000005a8);
  JsonTest::checkEqual<int,int>
            (result_00,(int)((ulong)expected >> 0x20),SUB84(expected,0),(char *)result,
             (uint)((ulong)file >> 0x20),expr);
  Json::Value::asLargestInt((Value *)0x14866f);
  JsonTest::checkEqual<int,long_long>
            (result_00,(int)((ulong)expected >> 0x20),(longlong)result,file,
             (uint)((ulong)expr >> 0x20),pcVar3);
  Json::Value::asUInt(in_stack_000005a8);
  JsonTest::checkEqual<int,unsigned_int>
            (result_00,(int)((ulong)expected >> 0x20),SUB84(expected,0),(char *)result,
             (uint)((ulong)file >> 0x20),expr);
  uVar2 = (uint)((ulong)expr >> 0x20);
  Json::Value::asLargestUInt((Value *)0x1486e8);
  JsonTest::checkEqual<int,unsigned_long_long>
            (result_00,(int)((ulong)expected >> 0x20),(unsigned_long_long)result,file,uVar2,pcVar3);
  Json::Value::asDouble((Value *)_minitest_Context.failure_);
  JsonTest::checkEqual<double,double>(result_00,expected,(double)result,file,uVar2,pcVar3);
  actual = (float)((ulong)result >> 0x20);
  Json::Value::asFloat((Value *)_minitest_Context.failure_);
  JsonTest::checkEqual<double,float>(result_00,expected,actual,file,uVar2,pcVar3);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, bools) {
  JSONTEST_ASSERT_EQUAL(Json::booleanValue, false_.type());

  IsCheck checks;
  checks.isBool_ = true;
  JSONTEST_ASSERT_PRED(checkIs(false_, checks));
  JSONTEST_ASSERT_PRED(checkIs(true_, checks));

  // False okay
  JSONTEST_ASSERT(false_.isConvertibleTo(Json::nullValue));

  // True not okay
  JSONTEST_ASSERT(!true_.isConvertibleTo(Json::nullValue));

  // Always okay
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(true_.isConvertibleTo(Json::stringValue));

  // Never okay
  JSONTEST_ASSERT(!true_.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!true_.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(true, true_.asBool());
  JSONTEST_ASSERT_EQUAL(1, true_.asInt());
  JSONTEST_ASSERT_EQUAL(1, true_.asLargestInt());
  JSONTEST_ASSERT_EQUAL(1, true_.asUInt());
  JSONTEST_ASSERT_EQUAL(1, true_.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(1.0, true_.asDouble());
  JSONTEST_ASSERT_EQUAL(1.0, true_.asFloat());

  JSONTEST_ASSERT_EQUAL(false, false_.asBool());
  JSONTEST_ASSERT_EQUAL(0, false_.asInt());
  JSONTEST_ASSERT_EQUAL(0, false_.asLargestInt());
  JSONTEST_ASSERT_EQUAL(0, false_.asUInt());
  JSONTEST_ASSERT_EQUAL(0, false_.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(0.0, false_.asDouble());
  JSONTEST_ASSERT_EQUAL(0.0, false_.asFloat());
}